

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromString(Parser *this,string *input,Message *output)

{
  bool bVar1;
  void *in_RDI;
  ArrayInputStream input_stream;
  Message *in_stack_000000f0;
  ZeroCopyInputStream *in_stack_000000f8;
  Parser *in_stack_00000100;
  ErrorCollector *in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  StringPiece *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ArrayInputStream *in_stack_ffffffffffffffa0;
  undefined1 local_1;
  
  StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = anon_unknown_19::CheckParseInputSize((StringPiece)in_stack_00000110,in_stack_00000108);
  if (bVar1) {
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream
              (in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
    ;
    local_1 = Parse(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)0x432ad0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TextFormat::Parser::ParseFromString(const std::string& input,
                                         Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::ArrayInputStream input_stream(input.data(), input.size());
  return Parse(&input_stream, output);
}